

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsProtocol.cpp
# Opt level: O0

void __thiscall xs::MessageParser::getString(MessageParser *this,string *dst)

{
  size_t sVar1;
  deBool dVar2;
  Error *this_00;
  bool bVar3;
  string *dst_local;
  MessageParser *this_local;
  
  do {
    if (this->m_data[this->m_pos] == '\0') {
      this->m_pos = this->m_pos + 1;
      return;
    }
    sVar1 = this->m_pos;
    this->m_pos = sVar1 + 1;
    std::__cxx11::string::operator+=((string *)dst,this->m_data[sVar1]);
    do {
      dVar2 = deGetFalse();
      bVar3 = false;
      if (dVar2 == 0) {
        bVar3 = this->m_pos < this->m_size;
      }
      if (!bVar3) {
        this_00 = (Error *)__cxa_allocate_exception(0x10);
        Error::Error(this_00,"Unterminated string payload","m_pos < m_size",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/execserver/xsProtocol.cpp"
                     ,0x49);
        __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
      }
      dVar2 = deGetFalse();
    } while (dVar2 != 0);
  } while( true );
}

Assistant:

void getString (std::string& dst)
	{
		// \todo [2011-09-30 pyry] We should really send a size parameter instead.
		while (m_data[m_pos] != 0)
		{
			dst += (char)m_data[m_pos++];
			XS_CHECK_MSG(m_pos < m_size, "Unterminated string payload");
		}

		m_pos += 1;
	}